

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * __thiscall
flatbuffers::NumToString<std::__cxx11::string>
          (string *__return_storage_ptr__,flatbuffers *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  flatbuffers *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  
  local_18 = this;
  t_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,(string *)this);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string NumToString(T t) {
  // clang-format off

  #ifndef FLATBUFFERS_PREFER_PRINTF
    std::stringstream ss;
    ss << t;
    return ss.str();
  #else // FLATBUFFERS_PREFER_PRINTF
    auto v = static_cast<long long>(t);
    return NumToStringImplWrapper(v, "%.*lld");
  #endif // FLATBUFFERS_PREFER_PRINTF
  // clang-format on
}